

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

size_t __thiscall
axl::sl::Array<char,_axl::sl::ArrayDetails<char>_>::setBuffer
          (Array<char,_axl::sl::ArrayDetails<char>_> *this,BufKind kind,void *p,size_t size)

{
  BufHdr *pBVar1;
  long in_RCX;
  int in_ESI;
  BufHdr *in_RDI;
  Ptr<axl::rc::BufHdr> hdr;
  uint_t flags;
  size_t bufferSize;
  BufHdr *in_stack_ffffffffffffff78;
  BufHdr *in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  Ptr local_40 [20];
  int local_2c;
  size_t local_28;
  
  local_28 = in_RCX - 0x28;
  local_2c = (uint)(in_ESI != 1) << 2;
  rc::BufHdr::BufHdr(in_RDI,in_stack_ffffffffffffff88,(uintptr_t)in_stack_ffffffffffffff80);
  rc::primeRefCount<axl::rc::BufHdr>
            (in_stack_ffffffffffffff80,(FreeFunc *)in_stack_ffffffffffffff78);
  rc::Ptr<axl::rc::BufHdr>::Ptr<axl::rc::BufHdr>
            ((Ptr<axl::rc::BufHdr> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pBVar1 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
  SimpleArrayDetails<char>::setHdrCount(pBVar1,0);
  if ((in_RDI->super_RefCount).m_freeFunc != (FreeFunc *)0x0) {
    rc::RefCount::release(&in_stack_ffffffffffffff80->super_RefCount);
  }
  pBVar1 = rc::Ptr::operator_cast_to_BufHdr_(local_40);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)(pBVar1 + 1);
  pBVar1 = rc::Ptr<axl::rc::BufHdr>::detach((Ptr<axl::rc::BufHdr> *)in_RDI,(RefCount **)pBVar1);
  (in_RDI->super_RefCount).m_freeFunc = (FreeFunc *)pBVar1;
  (in_RDI->super_RefCount).m_refCount = 0;
  (in_RDI->super_RefCount).m_weakRefCount = 0;
  rc::Ptr<axl::rc::BufHdr>::~Ptr((Ptr<axl::rc::BufHdr> *)0x116733);
  return local_28;
}

Assistant:

size_t
	setBuffer(
		rc::BufKind kind,
		void* p,
		size_t size
	) {
		ASSERT(size >= sizeof(Hdr) + sizeof(T));

		size_t bufferSize = size - sizeof(Hdr);
		uint_t flags = kind != rc::BufKind_Static ? rc::BufHdrFlag_Exclusive : 0;

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_INPLACE(Hdr, (bufferSize, flags), p, NULL);
		Details::setHdrCount(hdr, 0);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = (T*)(hdr + 1);
		this->m_hdr = hdr.detach();
		this->m_count = 0;

		return bufferSize / sizeof(T);
	}